

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

bool cmState::ParseCacheEntry(string *entry,string *var,string *value,CacheEntryType *type)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  bool bVar6;
  CacheEntryType CVar7;
  int iVar8;
  char *local_50;
  undefined8 local_48;
  char local_40;
  undefined7 uStack_3f;
  
  if ((ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
       ::reg == '\0') &&
     (iVar8 = __cxa_guard_acquire(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
                                   ::reg), iVar8 != 0)) {
    ParseCacheEntry::reg.program = (char *)0x0;
    cmsys::RegularExpression::compile
              (&ParseCacheEntry::reg,"^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseCacheEntry::reg,&__dso_handle);
    __cxa_guard_release(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
                         ::reg);
  }
  if ((ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
       ::regQuoted == '\0') &&
     (iVar8 = __cxa_guard_acquire(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
                                   ::regQuoted), iVar8 != 0)) {
    ParseCacheEntry::regQuoted.program = (char *)0x0;
    cmsys::RegularExpression::compile
              (&ParseCacheEntry::regQuoted,"^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseCacheEntry::regQuoted,
                 &__dso_handle);
    __cxa_guard_release(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
                         ::regQuoted);
  }
  bVar6 = cmsys::RegularExpression::find(&ParseCacheEntry::regQuoted,(entry->_M_dataplus)._M_p);
  if (bVar6) {
    if (ParseCacheEntry::regQuoted.startp[1] == (char *)0x0) {
      local_50 = &local_40;
      local_48 = 0;
      local_40 = '\0';
    }
    else {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,ParseCacheEntry::regQuoted.startp[1],
                 ParseCacheEntry::regQuoted.endp[1]);
    }
    std::__cxx11::string::operator=((string *)var,(string *)&local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    local_50 = &local_40;
    if (ParseCacheEntry::regQuoted.startp[2] == (char *)0x0) {
      local_48 = 0;
      local_40 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,ParseCacheEntry::regQuoted.startp[2],
                 ParseCacheEntry::regQuoted.endp[2]);
    }
    pcVar5 = local_50;
    CVar7 = StringToCacheEntryType(local_50);
    *type = CVar7;
    pcVar1 = ParseCacheEntry::regQuoted.startp[3];
    pcVar2 = ParseCacheEntry::regQuoted.endp[3];
    if (pcVar5 != &local_40) {
      operator_delete(pcVar5,CONCAT71(uStack_3f,local_40) + 1);
      pcVar1 = ParseCacheEntry::regQuoted.startp[3];
      pcVar2 = ParseCacheEntry::regQuoted.endp[3];
    }
joined_r0x0035620c:
    if (pcVar1 == (char *)0x0) {
      local_50 = &local_40;
      local_48 = 0;
      local_40 = '\0';
    }
    else {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar1,pcVar2);
    }
    std::__cxx11::string::operator=((string *)value,(string *)&local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    bVar6 = true;
  }
  else {
    bVar6 = cmsys::RegularExpression::find(&ParseCacheEntry::reg,(entry->_M_dataplus)._M_p);
    if (bVar6) {
      local_50 = &local_40;
      if (ParseCacheEntry::reg.startp[1] == (char *)0x0) {
        local_48 = 0;
        local_40 = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,ParseCacheEntry::reg.startp[1],ParseCacheEntry::reg.endp[1]);
      }
      std::__cxx11::string::operator=((string *)var,(string *)&local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      if (ParseCacheEntry::reg.startp[2] == (char *)0x0) {
        local_48 = 0;
        local_40 = '\0';
        local_50 = &local_40;
      }
      else {
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,ParseCacheEntry::reg.startp[2],ParseCacheEntry::reg.endp[2]);
      }
      pcVar5 = local_50;
      CVar7 = StringToCacheEntryType(local_50);
      *type = CVar7;
      pcVar1 = ParseCacheEntry::reg.startp[3];
      pcVar2 = ParseCacheEntry::reg.endp[3];
      if (pcVar5 != &local_40) {
        operator_delete(pcVar5,CONCAT71(uStack_3f,local_40) + 1);
        pcVar1 = ParseCacheEntry::reg.startp[3];
        pcVar2 = ParseCacheEntry::reg.endp[3];
      }
      goto joined_r0x0035620c;
    }
    bVar6 = false;
  }
  if (bVar6) {
    if (((1 < value->_M_string_length) && (pcVar1 = (value->_M_dataplus)._M_p, *pcVar1 == '\'')) &&
       (pcVar1[value->_M_string_length - 1] == '\'')) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)value);
      std::__cxx11::string::operator=((string *)value,(string *)&local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
    }
    if (bVar6) {
      return true;
    }
  }
  if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
       ::reg == '\0') &&
     (iVar8 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                   ::reg), iVar8 != 0)) {
    ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)::
    reg._184_8_ = 0;
    cmsys::RegularExpression::compile
              ((RegularExpression *)
               ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
               ::reg,"^([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::reg,&__dso_handle);
    __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                         ::reg);
  }
  if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
       ::regQuoted == '\0') &&
     (iVar8 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                   ::regQuoted), iVar8 != 0)) {
    ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)::
    regQuoted._184_8_ = 0;
    cmsys::RegularExpression::compile
              ((RegularExpression *)
               ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
               ::regQuoted,"^\"([^\"]*)\"=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::regQuoted,&__dso_handle);
    __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                         ::regQuoted);
  }
  bVar6 = cmsys::RegularExpression::find
                    ((RegularExpression *)
                     ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                     ::regQuoted,(entry->_M_dataplus)._M_p);
  if (bVar6) {
    if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
        ::regQuoted._8_8_ == 0) {
      local_50 = &local_40;
      local_48 = 0;
      local_40 = '\0';
    }
    else {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::regQuoted._8_8_,
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::regQuoted._88_8_);
    }
    std::__cxx11::string::operator=((string *)var,(string *)&local_50);
    lVar3 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
            ::regQuoted._16_8_;
    uVar4 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
            ::regQuoted._96_8_;
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      lVar3 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::regQuoted._16_8_;
      uVar4 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::regQuoted._96_8_;
    }
  }
  else {
    bVar6 = cmsys::RegularExpression::find
                      ((RegularExpression *)
                       ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                       ::reg,(entry->_M_dataplus)._M_p);
    if (!bVar6) {
      bVar6 = false;
      goto LAB_00356450;
    }
    if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
        ::reg._8_8_ == 0) {
      local_50 = &local_40;
      local_48 = 0;
      local_40 = '\0';
    }
    else {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::reg._8_8_,
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::reg._88_8_);
    }
    std::__cxx11::string::operator=((string *)var,(string *)&local_50);
    lVar3 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
            ::reg._16_8_;
    uVar4 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
            ::reg._96_8_;
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      lVar3 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::reg._16_8_;
      uVar4 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::reg._96_8_;
    }
  }
  if (lVar3 == 0) {
    local_50 = &local_40;
    local_48 = 0;
    local_40 = '\0';
  }
  else {
    local_50 = &local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,lVar3,uVar4);
  }
  std::__cxx11::string::operator=((string *)value,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  bVar6 = true;
LAB_00356450:
  if ((((bVar6 != false) && (1 < value->_M_string_length)) &&
      (pcVar1 = (value->_M_dataplus)._M_p, *pcVar1 == '\'')) &&
     (pcVar1[value->_M_string_length - 1] == '\'')) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)value);
    std::__cxx11::string::operator=((string *)value,(string *)&local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
  }
  return bVar6;
}

Assistant:

bool cmState::ParseCacheEntry(const std::string& entry,
                                std::string& var,
                                std::string& value,
                                CacheEntryType& type)
{
  // input line is:         key:type=value
  static cmsys::RegularExpression reg(
    "^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  // input line is:         "key":type=value
  static cmsys::RegularExpression regQuoted(
    "^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  bool flag = false;
  if(regQuoted.find(entry))
    {
    var = regQuoted.match(1);
    type = cmState::StringToCacheEntryType(regQuoted.match(2).c_str());
    value = regQuoted.match(3);
    flag = true;
    }
  else if (reg.find(entry))
    {
    var = reg.match(1);
    type = cmState::StringToCacheEntryType(reg.match(2).c_str());
    value = reg.match(3);
    flag = true;
    }

  // if value is enclosed in single quotes ('foo') then remove them
  // it is used to enclose trailing space or tab
  if (flag &&
      value.size() >= 2 &&
      value[0] == '\'' &&
      value[value.size() - 1] == '\'')
    {
    value = value.substr(1,
                         value.size() - 2);
    }

  if (!flag)
    {
    return ParseEntryWithoutType(entry, var, value);
    }

  return flag;
}